

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
* math::wide_integer::detail::my_own::frexp<long_double>
            (enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
             *__return_storage_ptr__,longdouble x,int *expptr)

{
  enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
  *peVar1;
  longdouble lVar2;
  
  lVar2 = -x;
  if (x <= lVar2 || lVar2 != x) {
    x = lVar2;
  }
  peVar1 = (enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
            *)0x0;
  if ((longdouble)4.2949673e+09 <= x) {
    peVar1 = (enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
              *)0x0;
    do {
      x = x * (longdouble)2.3283064e-10;
      peVar1 = (enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
                *)(ulong)((int)peVar1 + 0x20);
    } while ((longdouble)4.2949673e+09 <= x);
  }
  for (; (longdouble)1 <= x; x = x * (longdouble)0.5) {
    peVar1 = (enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
              *)(ulong)((int)peVar1 + 1);
  }
  if (__return_storage_ptr__ !=
      (enable_if_t<(std::is_floating_point<long_double>::value_&&_std::numeric_limits<long_double>::is_iec559),_long_double>
       *)0x0) {
    *(int *)__return_storage_ptr__ = (int)peVar1;
  }
  return peVar1;
}

Assistant:

constexpr auto frexp(FloatingPointType x, int* expptr) -> std::enable_if_t<(std::is_floating_point<FloatingPointType>::value &&   std::numeric_limits<FloatingPointType>::is_iec559 ), FloatingPointType>
  {
    using local_floating_point_type = FloatingPointType;

    const auto x_is_neg = (x < static_cast<local_floating_point_type>(0.0L));

    local_floating_point_type f = (x_is_neg ? -x : x); // NOLINT(altera-id-dependent-backward-branch)

    auto e2 = static_cast<int>(INT8_C(0));

    constexpr auto two_pow32 =
      static_cast<long double>
      (
        static_cast<long double>(0x10000) * static_cast<long double>(0x10000)
      );

    while(f >= static_cast<local_floating_point_type>(two_pow32)) // NOLINT(altera-id-dependent-backward-branch)
    {
      // TBD: Maybe optimize this exponent reduction
      // with a more clever kind of binary searching.

      f   = static_cast<local_floating_point_type>(f / static_cast<local_floating_point_type>(two_pow32));
      e2 += static_cast<int>(INT32_C(32));
    }

    constexpr auto one_ldbl = static_cast<long double>(1.0L);

    while(f >= static_cast<local_floating_point_type>(one_ldbl)) // NOLINT(altera-id-dependent-backward-branch)
    {
      constexpr auto two_ldbl = static_cast<long double>(2.0L);

      f = static_cast<local_floating_point_type>(f / static_cast<local_floating_point_type>(two_ldbl));

      ++e2;
    }

    if(expptr != nullptr)
    {
      *expptr = e2;
    }

    return ((!x_is_neg) ? f : -f);
  }